

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readScatteringLaw.hpp
# Opt level: O3

ScatteringLaw * __thiscall
njoy::ENDFtk::section::Type<7,2>::
readScatteringLaw<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (ScatteringLaw *__return_storage_ptr__,Type<7,2> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,int LTHR)

{
  undefined8 *puVar1;
  int MAT_00;
  MixedElastic local_158;
  
  MAT_00 = (int)lineNumber;
  if (MT == 3) {
    MixedElastic::MixedElastic<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((MixedElastic *)&local_158,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::__detail::__variant::_Uninitialized<njoy::ENDFtk::section::Type<7,2>::MixedElastic,false>::
    _Uninitialized<njoy::ENDFtk::section::Type<7,2>::MixedElastic>
              ((_Uninitialized<njoy::ENDFtk::section::Type<7,_2>::MixedElastic,_false> *)
               __return_storage_ptr__,&local_158);
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    ._M_index = '\x02';
    Type<7,_2>::MixedElastic::~MixedElastic(&local_158);
  }
  else if (MT == 2) {
    IncoherentElastic::IncoherentElastic<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((IncoherentElastic *)&local_158,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    *(_Head_base<5UL,_long,_false> *)
     &(__return_storage_ptr__->
      super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
      ).
      super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
      .
      super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
      .
      super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
      .
      super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
      .
      super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
      ._M_u = local_158.coherent_.principal_.super_InterpolationBase.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
              super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     ._M_u + 8) =
         local_158.coherent_.principal_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     ._M_u + 0x10) =
         local_158.coherent_.principal_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
         super__Head_base<3UL,_long,_false>._M_head_impl;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     ).
                     super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     .
                     super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     .
                     super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     .
                     super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     .
                     super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
                     ._M_u + 0x18) =
         local_158.coherent_.principal_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
         _M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x20) =
         local_158.coherent_.principal_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>
         ._M_head_impl;
    *(double *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x28) =
         local_158.coherent_.principal_.super_InterpolationBase.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Head_base<0UL,_double,_false>._M_head_impl;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x30) =
         local_158.coherent_.principal_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x38) =
         local_158.coherent_.principal_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x40) =
         local_158.coherent_.principal_.super_InterpolationBase.boundaryIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x48) =
         local_158.coherent_.principal_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x50) =
         local_158.coherent_.principal_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x58) =
         local_158.coherent_.principal_.super_InterpolationBase.interpolationSchemeIndices.
         super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x60) =
         local_158.coherent_.principal_.xValues.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x68) =
         local_158.coherent_.principal_.xValues.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x70) =
         local_158.coherent_.principal_.xValues.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x78) =
         local_158.coherent_.principal_.yValues.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x80) =
         local_158.coherent_.principal_.yValues.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ).
             super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             .
             super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
             ._M_u + 0x88) =
         local_158.coherent_.principal_.yValues.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    ._M_index = '\x01';
  }
  else {
    if (MT != 1) {
      tools::Log::error<char_const*>("Encountered illegal LTHR value");
      tools::Log::info<char_const*>("LTHR is either 1 (coherent), 2 (incoherent) or 3 (mixed)");
      tools::Log::info<char_const*,int>("LTHR value: {}",MT);
      tools::Log::info<char_const*,long>("Line number: {}",(long)end->_M_current);
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = getenv;
      __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
    }
    CoherentElastic::CoherentElastic<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((CoherentElastic *)&local_158,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,begin,(long *)end,MAT_00,MAT,MF);
    std::__detail::__variant::
    _Uninitialized<njoy::ENDFtk::section::Type<7,2>::CoherentElastic,false>::
    _Uninitialized<njoy::ENDFtk::section::Type<7,2>::CoherentElastic>
              ((_Uninitialized<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_false> *)
               __return_storage_ptr__,&local_158);
    (__return_storage_ptr__->
    super__Variant_base<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    ).
    super__Move_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    .
    super__Copy_assign_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    .
    super__Move_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    .
    super__Copy_ctor_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    .
    super__Variant_storage_alias<njoy::ENDFtk::section::Type<7,_2>::CoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::IncoherentElastic,_njoy::ENDFtk::section::Type<7,_2>::MixedElastic>
    ._M_index = '\0';
    std::vector<njoy::ENDFtk::ListRecord,_std::allocator<njoy::ENDFtk::ListRecord>_>::~vector
              (&local_158.coherent_.temperatures_);
    if (local_158.coherent_.principal_.yValues.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.coherent_.principal_.yValues.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.coherent_.principal_.yValues.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.coherent_.principal_.yValues.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_158.coherent_.principal_.xValues.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.coherent_.principal_.xValues.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.coherent_.principal_.xValues.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.coherent_.principal_.xValues.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_158.coherent_.principal_.super_InterpolationBase.interpolationSchemeIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_158.coherent_.principal_.super_InterpolationBase.
                      interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_158.coherent_.principal_.super_InterpolationBase.
                            interpolationSchemeIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.coherent_.principal_.super_InterpolationBase.
                            interpolationSchemeIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_158.coherent_.principal_.super_InterpolationBase.boundaryIndices.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_158.coherent_.principal_.super_InterpolationBase.boundaryIndices.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.coherent_.principal_.super_InterpolationBase.boundaryIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.coherent_.principal_.super_InterpolationBase.boundaryIndices.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static ScatteringLaw
readScatteringLaw( Iterator& begin,
                   const Iterator& end,
                   long& lineNumber,
                   int MAT,
                   int MF,
                   int MT,
                   int LTHR ) {

  switch ( LTHR ) {
    case 1: return CoherentElastic( begin, end, lineNumber, MAT, MF, MT );
    case 2: return IncoherentElastic( begin, end, lineNumber, MAT, MF, MT );
    case 3: return MixedElastic( begin, end, lineNumber, MAT, MF, MT );
    default : {
      Log::error( "Encountered illegal LTHR value" );
      Log::info( "LTHR is either 1 (coherent), 2 (incoherent) or 3 (mixed)" );
      Log::info( "LTHR value: {}", LTHR );
      Log::info( "Line number: {}", lineNumber );
      throw std::exception();
    }
  }
}